

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtils.cpp
# Opt level: O3

string * ApprovalTests::FileUtils::readFileReturnEmptyIfMissing
                   (string *__return_storage_ptr__,string *fileName)

{
  int iVar1;
  stat info;
  stat sStack_a8;
  
  memset(&sStack_a8,0,0x90);
  iVar1 = stat((fileName->_M_dataplus)._M_p,&sStack_a8);
  if (iVar1 == 0) {
    readFileThrowIfMissing(__return_storage_ptr__,fileName);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FileUtils::readFileReturnEmptyIfMissing(const std::string& fileName)
    {
        if (FileUtils::fileExists(fileName))
        {
            return readFileThrowIfMissing(fileName);
        }
        else
        {
            return std::string();
        }
    }